

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O1

h__Writer * __thiscall
ASDCP::TimedText::MXFWriter::h__Writer::WriteTimedTextResource
          (h__Writer *this,string *XMLDoc,AESEncContext *Ctx,HMACContext *HMAC)

{
  int *piVar1;
  h__AESContext *phVar2;
  ui32_t size;
  undefined1 *puVar3;
  IndexEntry Entry;
  FrameBuffer FrameBuf;
  IndexEntry local_108;
  FrameBuffer local_f0;
  
  if (*(int *)&XMLDoc[0x1b].field_2 == 2) {
    *(undefined4 *)&XMLDoc[0x1b].field_2 = 3;
    puVar3 = Kumu::RESULT_OK;
  }
  else {
    puVar3 = Kumu::RESULT_STATE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar3);
  if (-1 < *(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                    _vptr_TrackFileWriter) {
    phVar2 = Ctx[1].m_Context.m_p;
    size = (ui32_t)phVar2;
    FrameBuffer::FrameBuffer(&local_f0,size);
    memcpy(local_f0.super_FrameBuffer.m_Data,(Ctx->m_Context).m_p,(ulong)phVar2 & 0xffffffff);
    local_108.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00224af0;
    local_108.TemporalOffset = '\0';
    local_108.KeyFrameOffset = '\0';
    local_108.Flags = 0x80;
    local_108.StreamOffset = (ui64_t)XMLDoc[0x1a]._M_dataplus._M_p;
    local_f0.super_FrameBuffer.m_Size = size;
    h__ASDCPWriter::WriteEKLVPacket
              ((h__ASDCPWriter *)&stack0xffffffffffffff68,(FrameBuffer *)XMLDoc,(byte_t *)&local_f0,
               (ui32_t *)&XMLDoc[0x3c]._M_string_length,(AESEncContext *)&MXF_BER_LENGTH,HMAC);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
    if (-1 < *(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                      _vptr_TrackFileWriter) {
      MXF::OPAtomIndexFooter::PushIndexEntry
                ((OPAtomIndexFooter *)&XMLDoc[0x2b]._M_string_length,&local_108);
      piVar1 = (int *)((long)&XMLDoc[0x19].field_2 + 8);
      *piVar1 = *piVar1 + 1;
    }
    FrameBuffer::~FrameBuffer(&local_f0);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFWriter::h__Writer::WriteTimedTextResource(const std::string& XMLDoc,
							       ASDCP::AESEncContext* Ctx, ASDCP::HMACContext* HMAC)
{
  Result_t result = m_State.Goto_RUNNING();

  if ( ASDCP_SUCCESS(result) )
    {
      // TODO: make sure it's XML

      ui32_t str_size = XMLDoc.size();
      FrameBuffer FrameBuf(str_size);
      
      memcpy(FrameBuf.Data(), XMLDoc.c_str(), str_size);
      FrameBuf.Size(str_size);

      IndexTableSegment::IndexEntry Entry;
      Entry.StreamOffset = m_StreamOffset;
      result = WriteEKLVPacket(FrameBuf, m_EssenceUL, MXF_BER_LENGTH, Ctx, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  m_FooterPart.PushIndexEntry(Entry);
	  m_FramesWritten++;
	}
    }

  return result;
}